

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O2

void mp::WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::LinTerms>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *algc,ItemNamer *vnam)

{
  double value;
  BasicWriter<char> *pBVar1;
  char *pcVar2;
  BasicStringRef<char> value_00;
  BasicStringRef<char> value_01;
  double local_28;
  
  value = (algc->super_AlgConRange).lb_;
  local_28 = (algc->super_AlgConRange).ub_;
  if ((-1.79769313486232e+308 < value) && (value < local_28)) {
    pBVar1 = fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value);
    value_00.size_ = 4;
    value_00.data_ = " <= ";
    fmt::BasicWriter<char>::operator<<(pBVar1,value_00);
  }
  WriteModelItem(wrt,&algc->super_LinTerms,vnam);
  if ((value != local_28) || (NAN(value) || NAN(local_28))) {
    if (1.79769313486232e+308 <= local_28) {
      return;
    }
    pcVar2 = " <= ";
  }
  else {
    pcVar2 = " == ";
    local_28 = value;
  }
  value_01.size_ = 4;
  value_01.data_ = pcVar2;
  pBVar1 = fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value_01);
  fmt::BasicWriter<char>::operator<<(pBVar1,local_28);
  return;
}

Assistant:

inline void WriteModelItem(Writer& wrt,
                    const AlgebraicConstraint<Body, AlgConRange>& algc,
                    ItemNamer& vnam) {
  const auto& rng = algc.GetRhsOrRange();
  if (rng.lb() > -DBL_MAX && rng.lb() < rng.ub())
    wrt << rng.lb() << " <= ";
  WriteModelItem(wrt, algc.GetBody(), vnam);
  if (rng.lb() == rng.ub())
    wrt << " == " << rng.lb();
  else if (rng.ub() < DBL_MAX)
    wrt << " <= " << rng.ub();
}